

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O0

String * String::fromPrintf(String *__return_storage_ptr__,char *format,...)

{
  code *pcVar1;
  char in_AL;
  int iVar2;
  int iVar3;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_128 [16];
  undefined8 local_118;
  undefined8 local_110;
  undefined8 local_108;
  undefined8 local_100;
  undefined8 local_f8;
  undefined8 local_e8;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined4 local_78;
  undefined4 local_68;
  undefined4 local_64;
  va_list ap;
  undefined1 auStack_40 [4];
  int result;
  String s;
  char *format_local;
  
  if (in_AL != '\0') {
    local_f8 = in_XMM0_Qa;
    local_e8 = in_XMM1_Qa;
    local_d8 = in_XMM2_Qa;
    local_c8 = in_XMM3_Qa;
    local_b8 = in_XMM4_Qa;
    local_a8 = in_XMM5_Qa;
    local_98 = in_XMM6_Qa;
    local_88 = in_XMM7_Qa;
  }
  local_118 = in_RDX;
  local_110 = in_RCX;
  local_108 = in_R8;
  local_100 = in_R9;
  s._data.ref = (usize)format;
  String((String *)auStack_40,200);
  ap[0].overflow_arg_area = local_128;
  ap[0]._0_8_ = &stack0x00000008;
  local_64 = 0x30;
  local_68 = 0x10;
  iVar2 = vsnprintf(_auStack_40->str,_auStack_40->capacity,(char *)s._data.ref,&local_68);
  if ((iVar2 < 0) || (_auStack_40->capacity <= (ulong)(long)iVar2)) {
    ap[0].overflow_arg_area = local_128;
    ap[0]._0_8_ = &stack0x00000008;
    local_64 = 0x30;
    local_68 = 0x10;
    iVar2 = vsnprintf((char *)0x0,0,(char *)s._data.ref,&local_68);
    if (iVar2 < 0) {
      iVar3 = Debug::printf("%s:%u: assertion failed: %s\n",
                            "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/String.cpp"
                            ,0x55,"result >= 0");
      if (iVar3 != 0) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
    }
    if (iVar2 < 0) {
      String(__return_storage_ptr__);
    }
    else {
      detach((String *)auStack_40,0,(long)iVar2);
      ap[0].overflow_arg_area = local_128;
      ap[0]._0_8_ = &stack0x00000008;
      local_64 = 0x30;
      local_68 = 0x10;
      iVar2 = vsnprintf(_auStack_40->str,(long)(iVar2 + 1),(char *)s._data.ref,&local_68);
      if (iVar2 < 0) {
        iVar3 = Debug::printf("%s:%u: assertion failed: %s\n",
                              "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/String.cpp"
                              ,0x5c,"result >= 0");
        if (iVar3 != 0) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
      }
      _auStack_40->len = (long)iVar2;
      String(__return_storage_ptr__,(String *)auStack_40);
    }
  }
  else {
    _auStack_40->len = (long)iVar2;
    String(__return_storage_ptr__,(String *)auStack_40);
  }
  local_78 = 1;
  ~String((String *)auStack_40);
  return __return_storage_ptr__;
}

Assistant:

String String::fromPrintf(const char* format, ...)
{
  String s(200);

  int result;
  va_list ap;
  va_start(ap, format);

  {
    result = vsnprintf((char*)s.data->str, s.data->capacity, format, ap);
    va_end(ap);
    if(result >= 0 && (usize)result < s.data->capacity)
    {
      s.data->len = result;
      return s;
    }
  }

  // buffer was too small: compute size, reserve buffer, print again
  {
    va_start(ap, format);
#ifdef _MSC_VER
    result = _vscprintf(format, ap);
#else
    result = vsnprintf(0, 0, format, ap);
#endif
    va_end(ap);
    ASSERT(result >= 0);
    if(result < 0)
      return String();
    s.detach(0, result);
    va_start(ap, format);
    result = vsnprintf((char*)s.data->str, result + 1, format, ap);
    va_end(ap);
    ASSERT(result >= 0);
    s.data->len = result;
    va_end(ap);
    return s;
  }
}